

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Functional::NumSamplesParams::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,NumSamplesParams *this,NumSamplesParams *params)

{
  int iVar1;
  bool bVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  ostringstream os;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  bVar2 = true;
  for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
    iVar1 = *(int *)((long)this->numSamples + lVar5);
    if (iVar1 != -2) {
      if (!bVar2) {
        std::operator<<((ostream *)local_1a8,", ");
      }
      pcVar6 = "texture ";
      poVar3 = local_1a8;
      if (iVar1 != -1) {
        poVar3 = (ostringstream *)std::ostream::operator<<(local_1a8,iVar1);
        pcVar6 = "-sample renderbuffer ";
      }
      poVar4 = std::operator<<((ostream *)poVar3,pcVar6);
      poVar4 = std::operator<<(poVar4,(char *)((long)&
                                                  _ZZN4deqp5gles310Functional16NumSamplesParams14getDescriptionB5cxx11ERKS2_E7s_names_rel
                                              + (long)*(int *)((long)&
                                                  _ZZN4deqp5gles310Functional16NumSamplesParams14getDescriptionB5cxx11ERKS2_E7s_names_rel
                                                  + lVar5)));
      std::operator<<(poVar4," attachment");
      bVar2 = false;
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string NumSamplesParams::getDescription (const NumSamplesParams& params)
{
	ostringstream os;
	bool first = true;
	static const char* const s_names[] = { "color", "depth", "stencil" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_names) == DE_LENGTH_OF_ARRAY(params.numSamples));

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_names); i++)
	{
		GLsizei ns = params.numSamples[i];

		if (ns == SAMPLES_NONE)
			continue;

		if (first)
			first = false;
		else
			os << ", ";

		if (ns == SAMPLES_TEXTURE)
			os << "texture " << s_names[i] << " attachment";
		else
			os << ns << "-sample renderbuffer " << s_names[i] << " attachment";
	}
	return os.str();
}